

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1731::TestCase1731(TestCase1731 *this)

{
  TestCase1731 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x6c3,"legacy test: Encoding/HasEmptyList");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c1308;
  return;
}

Assistant:

TEST(Encoding, HasEmptyList) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestAnyPointer>();

  EXPECT_EQ(1, root.totalSize().wordCount);

  EXPECT_FALSE(root.asReader().hasAnyPointerField());
  EXPECT_FALSE(root.hasAnyPointerField());
  root.getAnyPointerField().initAs<List<int32_t>>(0);
  EXPECT_TRUE(root.asReader().hasAnyPointerField());
  EXPECT_TRUE(root.hasAnyPointerField());

  EXPECT_EQ(1, root.totalSize().wordCount);
}